

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsortfilterproxymodel.cpp
# Opt level: O1

void QSortFilterProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> *pQVar1;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> QVar2;
  QRegularExpression *regularExpression;
  parameter_type pVar3;
  parameter_type pVar4;
  parameter_type re;
  QBindableInterface *pQVar5;
  long *plVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined4 local_4c;
  QRegularExpression local_48;
  undefined4 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    dynamicSortFilterChanged((QSortFilterProxyModel *)_o,*_a[1]);
    break;
  case 1:
    local_4c = *_a[1];
    iVar7 = 1;
    goto LAB_0048c2a5;
  case 2:
    local_4c = *_a[1];
    iVar7 = 2;
    goto LAB_0048c2a5;
  case 3:
    sortLocaleAwareChanged((QSortFilterProxyModel *)_o,*_a[1]);
    break;
  case 4:
    local_4c = *_a[1];
    iVar7 = 4;
    goto LAB_0048c2a5;
  case 5:
    local_4c = *_a[1];
    iVar7 = 5;
LAB_0048c2a5:
    puStack_40 = &local_4c;
    local_48.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
         (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,(void **)&local_48);
    break;
  case 6:
    recursiveFilteringEnabledChanged((QSortFilterProxyModel *)_o,*_a[1]);
    break;
  case 7:
    autoAcceptChildRowsChanged((QSortFilterProxyModel *)_o,*_a[1]);
    break;
  case 8:
    setFilterRegularExpression((QSortFilterProxyModel *)_o,(QString *)_a[1]);
    break;
  case 9:
    setFilterRegularExpression((QSortFilterProxyModel *)_o,(QRegularExpression *)_a[1]);
    break;
  case 10:
    setFilterWildcard((QSortFilterProxyModel *)_o,(QString *)_a[1]);
    break;
  case 0xb:
    setFilterFixedString((QSortFilterProxyModel *)_o,(QString *)_a[1]);
    break;
  case 0xc:
    invalidate((QSortFilterProxyModel *)_o);
  }
  switch(_c) {
  case ReadProperty:
switchD_0048c13a_caseD_1:
    if (9 < (uint)_id) goto LAB_0048c448;
    break;
  case WriteProperty:
    goto switchD_0048c13a_caseD_2;
  default:
    goto switchD_0048c13a_caseD_3;
  case IndexOfMethod:
    plVar6 = (long *)_a[1];
    if (((code *)*plVar6 == dynamicSortFilterChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0048c13a_caseD_3;
    }
    if (((code *)*plVar6 == filterCaseSensitivityChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_0048c13a_caseD_3;
    }
    if (((code *)*plVar6 == sortCaseSensitivityChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_0048c13a_caseD_3;
    }
    if (((code *)*plVar6 == sortLocaleAwareChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_0048c13a_caseD_3;
    }
    if (((code *)*plVar6 == sortRoleChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 4;
      goto switchD_0048c13a_caseD_3;
    }
    if (((code *)*plVar6 == filterRoleChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 5;
      goto switchD_0048c13a_caseD_3;
    }
    if (((code *)*plVar6 == recursiveFilteringEnabledChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 6;
      goto switchD_0048c13a_caseD_3;
    }
    if (((code *)*plVar6 == autoAcceptChildRowsChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 7;
      goto switchD_0048c13a_caseD_3;
    }
    if (_c != BindableProperty) {
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_0048c13a_caseD_3;
        goto switchD_0048c13a_caseD_1;
      }
      goto switchD_0048c13a_caseD_2;
    }
  case BindableProperty:
    goto switchD_0048c13a_caseD_8;
  }
  pQVar1 = (QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)*_a;
  switch(_id) {
  case 0:
    re = QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
         ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                  *)&(_o->d_ptr).d[3].children.d.size);
    QRegularExpression::QRegularExpression(&local_48,re);
    QVar2.d.ptr = pQVar1->d;
    pQVar1->d = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)local_48.d.d.ptr;
    local_48.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)QVar2.d.ptr;
    QRegularExpression::~QRegularExpression(&local_48);
    goto LAB_0048c448;
  case 1:
    pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
                     *)&(_o->d_ptr).d[3].children);
    break;
  case 2:
    pVar3 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
                     *)((long)&(_o->d_ptr).d[3].children.d.ptr + 3));
    goto LAB_0048c444;
  case 3:
    pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
                     *)((long)&(_o->d_ptr).d[3].children.d.ptr + 4));
    break;
  case 4:
    pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_sort_casesensitivity_offset,_&QSortFilterProxyModelPrivate::setSortCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::sortCaseSensitivityChangedForwarder,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_sort_casesensitivity_offset,_&QSortFilterProxyModelPrivate::setSortCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::sortCaseSensitivityChangedForwarder,_nullptr>
                     *)&(_o->d_ptr).d[3].parent);
    break;
  case 5:
    pVar3 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_sort_localeaware_offset,_&QSortFilterProxyModelPrivate::setSortLocaleAwareForwarder,_&QSortFilterProxyModelPrivate::sortLocaleAwareChangedForwarder,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_sort_localeaware_offset,_&QSortFilterProxyModelPrivate::setSortLocaleAwareForwarder,_&QSortFilterProxyModelPrivate::sortLocaleAwareChangedForwarder,_nullptr>
                     *)&(_o->d_ptr).d[3].children.d.ptr);
    goto LAB_0048c444;
  case 6:
    pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
                     *)((long)&(_o->d_ptr).d[3].parent + 4));
    break;
  case 7:
    pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                     *)((long)&(_o->d_ptr).d[3].children.d.d + 4));
    break;
  case 8:
    pVar3 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
                     *)((long)&(_o->d_ptr).d[3].children.d.ptr + 1));
    goto LAB_0048c444;
  case 9:
    pVar3 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_accept_children_offset,_&QSortFilterProxyModelPrivate::setAutoAcceptChildRowsForwarder,_&QSortFilterProxyModelPrivate::autoAcceptChildRowsChangedForwarder,_nullptr>
            ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_accept_children_offset,_&QSortFilterProxyModelPrivate::setAutoAcceptChildRowsForwarder,_&QSortFilterProxyModelPrivate::autoAcceptChildRowsChangedForwarder,_nullptr>
                     *)((long)&(_o->d_ptr).d[3].children.d.ptr + 2));
LAB_0048c444:
    *(parameter_type *)&pQVar1->d = pVar3;
    goto LAB_0048c448;
  }
  *(parameter_type *)&pQVar1->d = pVar4;
LAB_0048c448:
  if (_c != BindableProperty) {
    if (_c != WriteProperty) goto switchD_0048c13a_caseD_3;
switchD_0048c13a_caseD_2:
    if ((uint)_id < 10) {
      regularExpression = (QRegularExpression *)*_a;
      switch(_id) {
      case 0:
        setFilterRegularExpression((QSortFilterProxyModel *)_o,regularExpression);
        break;
      case 1:
        setFilterKeyColumn((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
        break;
      case 2:
        setDynamicSortFilter((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
        break;
      case 3:
        setFilterCaseSensitivity
                  ((QSortFilterProxyModel *)_o,*(CaseSensitivity *)&(regularExpression->d).d.ptr);
        break;
      case 4:
        setSortCaseSensitivity
                  ((QSortFilterProxyModel *)_o,*(CaseSensitivity *)&(regularExpression->d).d.ptr);
        break;
      case 5:
        setSortLocaleAware((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
        break;
      case 6:
        setSortRole((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
        break;
      case 7:
        setFilterRole((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
        break;
      case 8:
        setRecursiveFilteringEnabled
                  ((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
        break;
      case 9:
        setAutoAcceptChildRows((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
      }
    }
    if (_c != BindableProperty) goto switchD_0048c13a_caseD_3;
  }
switchD_0048c13a_caseD_8:
  switch(_id) {
  case 0:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[3].children.d.size;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  case 1:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[3].children;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  case 2:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 3);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  case 3:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>,_void>
              ::iface;
    break;
  case 4:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[3].parent;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_sort_casesensitivity_offset,_&QSortFilterProxyModelPrivate::setSortCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::sortCaseSensitivityChangedForwarder,_nullptr>,_void>
              ::iface;
    break;
  case 5:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[3].children.d.ptr;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_sort_localeaware_offset,_&QSortFilterProxyModelPrivate::setSortLocaleAwareForwarder,_&QSortFilterProxyModelPrivate::sortLocaleAwareChangedForwarder,_nullptr>,_void>
              ::iface;
    break;
  case 6:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[3].parent + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>,_void>
              ::iface;
    break;
  case 7:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[3].children.d.d + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>,_void>
              ::iface;
    break;
  case 8:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 1);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>,_void>
              ::iface;
    break;
  case 9:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 2);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_accept_children_offset,_&QSortFilterProxyModelPrivate::setAutoAcceptChildRowsForwarder,_&QSortFilterProxyModelPrivate::autoAcceptChildRowsChangedForwarder,_nullptr>,_void>
              ::iface;
    break;
  default:
    goto switchD_0048c13a_caseD_3;
  }
  plVar6[1] = (long)pQVar5;
switchD_0048c13a_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSortFilterProxyModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dynamicSortFilterChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->filterCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 2: _t->sortCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 3: _t->sortLocaleAwareChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->sortRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->filterRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->recursiveFilteringEnabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->autoAcceptChildRowsChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QRegularExpression>>(_a[1]))); break;
        case 10: _t->setFilterWildcard((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 11: _t->setFilterFixedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->invalidate(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::dynamicSortFilterChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::filterCaseSensitivityChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::sortCaseSensitivityChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::sortLocaleAwareChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::sortRoleChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::filterRoleChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::recursiveFilteringEnabledChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::autoAcceptChildRowsChanged, 7))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QRegularExpression*>(_v) = _t->filterRegularExpression(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->filterKeyColumn(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->dynamicSortFilter(); break;
        case 3: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->filterCaseSensitivity(); break;
        case 4: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->sortCaseSensitivity(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortLocaleAware(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->sortRole(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->filterRole(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isRecursiveFilteringEnabled(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->autoAcceptChildRows(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilterRegularExpression(*reinterpret_cast<QRegularExpression*>(_v)); break;
        case 1: _t->setFilterKeyColumn(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setDynamicSortFilter(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setFilterCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 4: _t->setSortCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 5: _t->setSortLocaleAware(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setSortRole(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setFilterRole(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setRecursiveFilteringEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setAutoAcceptChildRows(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRegularExpression(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterKeyColumn(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDynamicSortFilter(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterCaseSensitivity(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortCaseSensitivity(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableIsSortLocaleAware(); break;
        case 6: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortRole(); break;
        case 7: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRole(); break;
        case 8: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableRecursiveFilteringEnabled(); break;
        case 9: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableAutoAcceptChildRows(); break;
        default: break;
        }
    }
}